

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<MockProblemBuilder_&()>::UntypedPerformAction
          (FunctionMockerBase<MockProblemBuilder_&()> *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<MockProblemBuilder_&> *pAVar1;
  Action<MockProblemBuilder_&()> *in_RDX;
  ArgumentTuple *args;
  Action<MockProblemBuilder_&()> action;
  Action<MockProblemBuilder_&()> *in_stack_ffffffffffffffa8;
  ArgumentTuple *in_stack_ffffffffffffffc8;
  Action<MockProblemBuilder_&()> local_28;
  Action<MockProblemBuilder_&()> *local_18;
  
  local_18 = in_RDX;
  Action<MockProblemBuilder_&()>::Action(&local_28,in_stack_ffffffffffffffa8);
  pAVar1 = ActionResultHolder<MockProblemBuilder&>::PerformAction<MockProblemBuilder&()>
                     (local_18,in_stack_ffffffffffffffc8);
  Action<MockProblemBuilder_&()>::~Action((Action<MockProblemBuilder_&()> *)0x2db931);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }